

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_interactor.cpp
# Opt level: O2

void Am_Animation_Outside_Method_proc
               (Am_Object *inter,Am_Object *param_2,Am_Object *event_window,Am_Input_Event *ev)

{
  Am_Value *pAVar1;
  Am_Object command_obj;
  Am_Object object;
  Am_Inter_Internal_Method inter_method;
  
  object.data = (Am_Object_Data *)0x0;
  pAVar1 = Am_Object::Get(inter,0x11a,0);
  Am_Object::operator=(&object,pAVar1);
  inter_method.from_wrapper = (Am_Method_Wrapper *)0x0;
  inter_method.Call = (Am_Inter_Internal_Method_Type *)0x0;
  pAVar1 = Am_Object::Get(&Am_Interactor,0xc0,0);
  Am_Inter_Internal_Method::operator=(&inter_method,pAVar1);
  (*inter_method.Call)(inter,&object,event_window,ev);
  command_obj.data = (Am_Object_Data *)0x0;
  pAVar1 = Am_Object::Get(inter,0xc5,0);
  Am_Object::operator=(&command_obj,pAVar1);
  Am_Inter_Call_Both_Method
            (inter,&command_obj,0xc9,ev->x,ev->y,event_window,&ev->input_char,&object,
             &Am_No_Location);
  Am_Object::~Am_Object(&command_obj);
  Am_Object::~Am_Object(&object);
  return;
}

Assistant:

Am_Define_Method(Am_Inter_Internal_Method, void, Am_Animation_Outside_Method,
                 (Am_Object & inter, Am_Object & /* object */,
                  Am_Object &event_window, Am_Input_Event *ev))
{
  Am_INTER_TRACE_PRINT(inter, "Animation Outside");

  // ignore object parameter, used saved object
  Am_Object object;
  object = inter.Get(Am_START_OBJECT);

  // first, call the prototype's method
  Am_Inter_Internal_Method inter_method;
  inter_method = Am_Interactor.Get(Am_INTER_OUTSIDE_METHOD);
  inter_method.Call(inter, object, event_window, ev);

  // Now, call the abort Command method
  Am_Object command_obj;
  command_obj = inter.Get(Am_COMMAND);
  Am_Inter_Call_Both_Method(inter, command_obj, Am_ABORT_DO_METHOD, ev->x,
                            ev->y, event_window, ev->input_char, object,
                            Am_No_Location);
}